

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CadicalInterfacing.cpp
# Opt level: O0

VarAssignment __thiscall SAT::CadicalInterfacing::getAssignment(CadicalInterfacing *this,uint var)

{
  int iVar1;
  int in_ESI;
  undefined8 in_RDI;
  int phase;
  undefined4 in_stack_ffffffffffffffe0;
  VarAssignment local_4;
  
  iVar1 = CaDiCaL::Solver::vars((Solver *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
  if (iVar1 < in_ESI) {
    local_4 = DONT_CARE;
  }
  else {
    iVar1 = CaDiCaL::Solver::val
                      ((Solver *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_RDI >> 0x20));
    local_4 = (VarAssignment)(iVar1 < 1);
  }
  return local_4;
}

Assistant:

SATSolver::VarAssignment CadicalInterfacing::getAssignment(unsigned var)
{
  ASS_EQ(_status, Status::SATISFIABLE);
  ASS_G(var,0); ASS_L((int)var,_next);

  if((int)var > _solver.vars())
    return VarAssignment::DONT_CARE;
  int phase = _solver.val(var);
  return phase > 0 ? VarAssignment::TRUE : VarAssignment::FALSE;
}